

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall Mesh::draw_mesh(Mesh *this,uint program_ID,uint zprogram,ZRender *zrender)

{
  PFNGLBINDTEXTUREPROC p_Var1;
  PFNGLGETUNIFORMLOCATIONPROC p_Var2;
  PFNGLUNIFORM1FPROC p_Var3;
  PFNGLUNIFORM1IPROC p_Var4;
  bool bVar5;
  GLint GVar6;
  size_type sVar7;
  reference pvVar8;
  GLchar *pGVar9;
  int local_e4;
  undefined1 local_e0 [4];
  int j_1;
  string local_c0;
  string local_a0;
  undefined1 local_70 [8];
  string texture_type;
  string number;
  uint i;
  uint specular_count;
  uint diffuse_count;
  int j;
  ZRender *zrender_local;
  uint zprogram_local;
  uint program_ID_local;
  Mesh *this_local;
  
  (*glad_glBindVertexArray)(this->VAO);
  (*glad_glBindFramebuffer)(0x8d40,zrender->depthFBO);
  (*glad_glUseProgram)(zprogram);
  p_Var4 = glad_glUniform1i;
  GVar6 = (*glad_glGetUniformLocation)(zprogram,"zbuffer");
  (*p_Var4)(GVar6,0);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,zrender->activeDepth);
  for (specular_count = 0;
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->indices),
      (ulong)(long)(int)specular_count < sVar7 / 3; specular_count = specular_count + 1) {
    (*glad_glDrawElements)(4,3,0x1405,(void *)((long)(int)(specular_count * 3) << 2));
  }
  (*glad_glBindFramebuffer)(0x8d40,zrender->colorFBO);
  (*glad_glUseProgram)(program_ID);
  i = 1;
  number.field_2._12_4_ = 1;
  for (number.field_2._8_4_ = 0;
      sVar7 = std::vector<Texture,_std::allocator<Texture>_>::size(&this->textures),
      (uint)number.field_2._8_4_ < sVar7; number.field_2._8_4_ = number.field_2._8_4_ + 1) {
    (*glad_glActiveTexture)(number.field_2._8_4_ + 0x84c0);
    std::__cxx11::string::string((string *)(texture_type.field_2._M_local_buf + 8));
    pvVar8 = std::vector<Texture,_std::allocator<Texture>_>::operator[]
                       (&this->textures,(ulong)(uint)number.field_2._8_4_);
    std::__cxx11::string::string((string *)local_70,(string *)&pvVar8->type);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70,"texture_diffuse");
    if (bVar5) {
      std::__cxx11::to_string(&local_a0,i);
      std::__cxx11::string::operator=
                ((string *)(texture_type.field_2._M_local_buf + 8),(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      i = i + 1;
    }
    else {
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70,"texture_specular");
      if (bVar5) {
        std::__cxx11::to_string(&local_c0,number.field_2._12_4_);
        std::__cxx11::string::operator=
                  ((string *)(texture_type.field_2._M_local_buf + 8),(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        number.field_2._12_4_ = number.field_2._12_4_ + 1;
      }
    }
    p_Var3 = glad_glUniform1f;
    p_Var2 = glad_glGetUniformLocation;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&texture_type.field_2 + 8));
    pGVar9 = (GLchar *)std::__cxx11::string::c_str();
    GVar6 = (*p_Var2)(program_ID,pGVar9);
    (*p_Var3)(GVar6,(float)(uint)number.field_2._8_4_);
    std::__cxx11::string::~string((string *)local_e0);
    (*glad_glActiveTexture)(number.field_2._8_4_ + 0x84c0);
    p_Var1 = glad_glBindTexture;
    pvVar8 = std::vector<Texture,_std::allocator<Texture>_>::operator[]
                       (&this->textures,(ulong)(uint)number.field_2._8_4_);
    (*p_Var1)(0xde1,pvVar8->id);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(texture_type.field_2._M_local_buf + 8));
  }
  Render::ZRender::bindBuffers(zrender,program_ID);
  for (local_e4 = 0;
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->indices),
      (ulong)(long)local_e4 < sVar7 / 3; local_e4 = local_e4 + 1) {
    (*glad_glDrawElements)(4,3,0x1405,(void *)((long)(local_e4 * 3) << 2));
  }
  return;
}

Assistant:

void Mesh::draw_mesh(unsigned int program_ID, unsigned int zprogram, Render::ZRender& zrender)
{

  glBindVertexArray(VAO);

  glBindFramebuffer(GL_FRAMEBUFFER,zrender.depthFBO);   
  glUseProgram(zprogram);
  glUniform1i(glGetUniformLocation(zprogram,"zbuffer"),0);
  glActiveTexture(GL_TEXTURE0);

  glBindTexture(GL_TEXTURE_2D,zrender.activeDepth);

  for (int j = 0; j < indices.size()/3; j++)
    glDrawElements(GL_TRIANGLES,3,GL_UNSIGNED_INT,reinterpret_cast<void*>(j*3*sizeof(unsigned int)));

  

 glBindFramebuffer(GL_FRAMEBUFFER,zrender.colorFBO);
 glUseProgram(program_ID);

   unsigned int diffuse_count = 1;
   unsigned int specular_count = 1;
   for (unsigned int i = 0; i < textures.size(); i++) {
     glActiveTexture(GL_TEXTURE0 + i); // activate proper texture unit before binding
     std::string number;
     std::string texture_type = textures[i].type;
     if (texture_type == "texture_diffuse") {
	number = std::to_string(diffuse_count++);
     } else if (texture_type == "texture_specular") {
	number = std::to_string(specular_count++);
     }

     // do I not need to use program here?
     glUniform1f(glGetUniformLocation(program_ID,
				       (texture_type + number).c_str()), i);
     glActiveTexture(GL_TEXTURE0 + i); // wait why this again?
     glBindTexture(GL_TEXTURE_2D, textures[i].id);
   }
  zrender.bindBuffers(program_ID);
  for (int j = 0; j < indices.size()/3; j++)
  {
    glDrawElements(GL_TRIANGLES,3,GL_UNSIGNED_INT,reinterpret_cast<void*>(j*3*sizeof(unsigned int)));
   }
 
}